

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O1

int cgltf_parse_json_unprocessed_extensions
              (cgltf_options *options,jsmntok_t *tokens,int i,uint8_t *json_chunk,
              cgltf_size *out_extensions_count,cgltf_extension **out_extensions)

{
  int iVar1;
  cgltf_size cVar2;
  cgltf_extension *__s;
  int i_00;
  uint uVar3;
  ulong uVar4;
  
  if ((tokens[(long)i + 1].type != JSMN_OBJECT) || (*out_extensions != (cgltf_extension *)0x0)) {
    return -1;
  }
  iVar1 = tokens[(long)i + 1].size;
  uVar4 = (ulong)iVar1;
  *out_extensions_count = 0;
  if (-1 < (long)uVar4) {
    __s = (cgltf_extension *)(*(options->memory).alloc)((options->memory).user_data,uVar4 << 4);
    if (__s != (cgltf_extension *)0x0) {
      memset(__s,0,uVar4 << 4);
      goto LAB_00117faf;
    }
  }
  __s = (cgltf_extension *)0x0;
LAB_00117faf:
  *out_extensions = __s;
  if (__s == (cgltf_extension *)0x0) {
    i_00 = -2;
  }
  else {
    i_00 = i + 2;
    if (0 < iVar1) {
      do {
        if (tokens[i_00].type != JSMN_STRING) {
          return -1;
        }
        if (tokens[i_00].size == 0) {
          return -1;
        }
        cVar2 = *out_extensions_count;
        *out_extensions_count = cVar2 + 1;
        i_00 = cgltf_parse_json_unprocessed_extension
                         (options,tokens,i_00,json_chunk,*out_extensions + cVar2);
      } while ((-1 < i_00) && (uVar3 = (int)uVar4 - 1, uVar4 = (ulong)uVar3, uVar3 != 0));
    }
  }
  return i_00;
}

Assistant:

static int cgltf_parse_json_unprocessed_extensions(cgltf_options* options, jsmntok_t const* tokens, int i, const uint8_t* json_chunk, cgltf_size* out_extensions_count, cgltf_extension** out_extensions)
{
	++i;

	CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);
	if(*out_extensions)
	{
		return CGLTF_ERROR_JSON;
	}

	int extensions_size = tokens[i].size;
	*out_extensions_count = 0;
	*out_extensions = (cgltf_extension*)cgltf_calloc(options, sizeof(cgltf_extension), extensions_size);

	if (!*out_extensions)
	{
		return CGLTF_ERROR_NOMEM;
	}

	++i;

	for (int j = 0; j < extensions_size; ++j)
	{
		CGLTF_CHECK_KEY(tokens[i]);

		cgltf_size extension_index = (*out_extensions_count)++;
		cgltf_extension* extension = &((*out_extensions)[extension_index]);
		i = cgltf_parse_json_unprocessed_extension(options, tokens, i, json_chunk, extension);

		if (i < 0)
		{
			return i;
		}
	}
	return i;
}